

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_script.cpp
# Opt level: O1

void __thiscall
Script_IsP2wshScriptTest_Test::~Script_IsP2wshScriptTest_Test(Script_IsP2wshScriptTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Script, IsP2wshScriptTest) {
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_0);
  builder.AppendData(ByteData("0225718cefb8c26fdc0343681d116f5bdf6d6cd9dcf6a28067c76c9385e89fe3"));
  Script script = builder.Build();

  EXPECT_FALSE(script.IsP2pkScript());
  EXPECT_FALSE(script.IsP2pkhScript());
  EXPECT_FALSE(script.IsP2shScript());
  EXPECT_FALSE(script.IsMultisigScript());
  EXPECT_TRUE(script.IsWitnessProgram());
  EXPECT_FALSE(script.IsP2wpkhScript());
  EXPECT_TRUE(script.IsP2wshScript());
  EXPECT_FALSE(script.IsPegoutScript());
}